

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O1

void __thiscall
wasm::SExpressionWasmBuilder::parseTag(SExpressionWasmBuilder *this,Element *s,bool preParseImport)

{
  pointer *ppNVar1;
  iterator __position;
  size_t sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char *pcVar5;
  uintptr_t uVar6;
  bool bVar7;
  Tag *curr;
  Element *pEVar8;
  Tag *pTVar9;
  List *pLVar10;
  Element *pEVar11;
  Export *curr_00;
  Export *pEVar12;
  string *psVar13;
  undefined7 in_register_00000011;
  char *extraout_RDX;
  char *extraout_RDX_00;
  size_t sVar14;
  IString str;
  IString str_00;
  string_view sVar15;
  Signature SVar16;
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  undefined1 *local_150;
  long local_148;
  undefined1 local_140 [16];
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  HeapType local_50;
  HeapType tagType;
  
  tagType.id._0_4_ = (int)CONCAT71(in_register_00000011,preParseImport);
  curr = (Tag *)operator_new(0x48);
  (curr->super_Importable).super_Named.name.super_IString.str._M_len = 0;
  (curr->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&(curr->super_Importable).super_Named.hasExplicitName = 0;
  (curr->super_Importable).module.super_IString.str._M_len = 0;
  (curr->super_Importable).module.super_IString.str._M_str = (char *)0x0;
  (curr->super_Importable).base.super_IString.str._M_len = 0;
  (curr->super_Importable).base.super_IString.str._M_str = (char *)0x0;
  (curr->sig).params.id = 0;
  (curr->sig).results.id = 0;
  pEVar8 = Element::operator[](s,1);
  if (pEVar8->isList_ == false) {
    pEVar8 = Element::operator[](s,1);
    if ((pEVar8->isList_ != false) || ((pEVar8->dollared_ & 1U) == 0)) goto LAB_0099bbb8;
    pEVar8 = Element::operator[](s,1);
    sVar15 = (string_view)Element::str(pEVar8);
    (curr->super_Importable).super_Named.name.super_IString.str = sVar15;
    (curr->super_Importable).super_Named.hasExplicitName = true;
    pTVar9 = Module::getTagOrNull(this->wasm,(Name)sVar15);
    sVar14 = 2;
    if (pTVar9 != (Tag *)0x0) {
      psVar13 = (string *)__cxa_allocate_exception(0x30);
      local_170 = local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"duplicate tag","");
      tagType.id = pEVar8->line;
      sVar14 = pEVar8->col;
      uVar3 = *(undefined4 *)((long)&pEVar8->col + 4);
      *(string **)psVar13 = psVar13 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar13,local_170,local_170 + local_168);
      *(undefined4 *)(psVar13 + 0x20) = (undefined4)tagType.id;
      *(undefined4 *)(psVar13 + 0x24) = tagType.id._4_4_;
      *(int *)(psVar13 + 0x28) = (int)sVar14;
      *(undefined4 *)(psVar13 + 0x2c) = uVar3;
      __cxa_throw(psVar13,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
  else {
LAB_0099bbb8:
    sVar15 = (string_view)Name::fromInt((long)this->tagCounter);
    (curr->super_Importable).super_Named.name.super_IString.str = sVar15;
    pTVar9 = Module::getTagOrNull(this->wasm,(Name)sVar15);
    sVar14 = 1;
    if (pTVar9 != (Tag *)0x0) {
      __assert_fail("!wasm.getTagOrNull(tag->name)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-s-parser.cpp"
                    ,0xf78,"void wasm::SExpressionWasmBuilder::parseTag(Element &, bool)");
    }
  }
  this->tagCounter = this->tagCounter + 1;
  __position._M_current =
       (this->tagNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->tagNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
              ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->tagNames,__position,
               (Name *)curr);
  }
  else {
    pcVar5 = (curr->super_Importable).super_Named.name.super_IString.str._M_str;
    ((__position._M_current)->super_IString).str._M_len =
         (curr->super_Importable).super_Named.name.super_IString.str._M_len;
    ((__position._M_current)->super_IString).str._M_str = pcVar5;
    ppNVar1 = &(this->tagNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  pLVar10 = Element::list(s);
  if (sVar14 < (pLVar10->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
               usedElements) {
    pEVar8 = Element::operator[](s,(uint)sVar14);
    str.str._M_str = extraout_RDX;
    str.str._M_len = DAT_00dbd190;
    bVar7 = elementStartsWith(pEVar8,str);
    if (bVar7) {
      if ((char)tagType.id == '\0') {
        __assert_fail("preParseImport && \"import element in non-preParseImport mode\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-s-parser.cpp"
                      ,0xf7f,"void wasm::SExpressionWasmBuilder::parseTag(Element &, bool)");
      }
      pEVar8 = Element::operator[](s,(uint)sVar14);
      pLVar10 = Element::list(pEVar8);
      if ((pLVar10->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
          usedElements != 3) {
        psVar13 = (string *)__cxa_allocate_exception(0x30);
        local_150 = local_140;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"invalid import","");
        tagType.id = pEVar8->line;
        sVar14 = pEVar8->col;
        uVar3 = *(undefined4 *)((long)&pEVar8->col + 4);
        *(string **)psVar13 = psVar13 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar13,local_150,local_150 + local_148);
        *(undefined4 *)(psVar13 + 0x20) = (undefined4)tagType.id;
        *(undefined4 *)(psVar13 + 0x24) = tagType.id._4_4_;
        *(int *)(psVar13 + 0x28) = (int)sVar14;
        *(undefined4 *)(psVar13 + 0x2c) = uVar3;
        __cxa_throw(psVar13,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar11 = Element::operator[](pEVar8,1);
      if (pEVar11->isList_ != false) {
LAB_0099bf8d:
        psVar13 = (string *)__cxa_allocate_exception(0x30);
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"invalid import module name","");
        pEVar11 = Element::operator[](pEVar8,1);
        sVar14 = pEVar11->line;
        pEVar8 = Element::operator[](pEVar8,1);
        sVar2 = pEVar8->col;
        *(string **)psVar13 = psVar13 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar13,local_d0,local_d0 + local_c8);
        *(size_t *)(psVar13 + 0x20) = sVar14;
        *(size_t *)(psVar13 + 0x28) = sVar2;
        __cxa_throw(psVar13,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar11 = Element::operator[](pEVar8,1);
      if ((pEVar11->isList_ == false) && ((pEVar11->dollared_ & 1U) != 0)) goto LAB_0099bf8d;
      pEVar11 = Element::operator[](pEVar8,2);
      if (pEVar11->isList_ != false) {
LAB_0099c02d:
        psVar13 = (string *)__cxa_allocate_exception(0x30);
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"invalid import base name","");
        pEVar11 = Element::operator[](pEVar8,2);
        sVar14 = pEVar11->line;
        pEVar8 = Element::operator[](pEVar8,2);
        sVar2 = pEVar8->col;
        *(string **)psVar13 = psVar13 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar13,local_b0,local_b0 + local_a8);
        *(size_t *)(psVar13 + 0x20) = sVar14;
        *(size_t *)(psVar13 + 0x28) = sVar2;
        __cxa_throw(psVar13,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar11 = Element::operator[](pEVar8,2);
      if ((pEVar11->isList_ == false) && ((pEVar11->dollared_ & 1U) != 0)) goto LAB_0099c02d;
      pEVar11 = Element::operator[](pEVar8,1);
      sVar15 = (string_view)Element::str(pEVar11);
      (curr->super_Importable).module.super_IString.str = sVar15;
      pEVar8 = Element::operator[](pEVar8,2);
      sVar15 = (string_view)Element::str(pEVar8);
      sVar14 = sVar14 + 1;
      (curr->super_Importable).base.super_IString.str = sVar15;
    }
  }
  pLVar10 = Element::list(s);
  if (sVar14 < (pLVar10->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
               usedElements) {
    pEVar8 = Element::operator[](s,(uint)sVar14);
    str_00.str._M_str = extraout_RDX_00;
    str_00.str._M_len = DAT_00dbd180;
    bVar7 = elementStartsWith(pEVar8,str_00);
    if (bVar7) {
      tagType.id = (uintptr_t)Element::operator[](s,(uint)sVar14);
      if ((curr->super_Importable).module.super_IString.str._M_str != (char *)0x0) {
        psVar13 = (string *)__cxa_allocate_exception(0x30);
        local_130 = local_120;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,"import and export cannot be specified together","");
        uVar6 = *(uintptr_t *)(tagType.id + 0x40);
        uVar3 = *(undefined4 *)(tagType.id + 0x48);
        uVar4 = *(undefined4 *)(tagType.id + 0x4c);
        *(string **)psVar13 = psVar13 + 0x10;
        tagType.id = uVar6;
        std::__cxx11::string::_M_construct<char*>(psVar13,local_130,local_130 + local_128);
        *(undefined4 *)(psVar13 + 0x20) = (undefined4)tagType.id;
        *(undefined4 *)(psVar13 + 0x24) = tagType.id._4_4_;
        *(undefined4 *)(psVar13 + 0x28) = uVar3;
        *(undefined4 *)(psVar13 + 0x2c) = uVar4;
        __cxa_throw(psVar13,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pLVar10 = Element::list((Element *)tagType.id);
      if ((pLVar10->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
          usedElements != 2) {
        psVar13 = (string *)__cxa_allocate_exception(0x30);
        local_110 = local_100;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"invalid export","");
        uVar6 = *(uintptr_t *)(tagType.id + 0x40);
        uVar3 = *(undefined4 *)(tagType.id + 0x48);
        uVar4 = *(undefined4 *)(tagType.id + 0x4c);
        *(string **)psVar13 = psVar13 + 0x10;
        tagType.id = uVar6;
        std::__cxx11::string::_M_construct<char*>(psVar13,local_110,local_110 + local_108);
        *(undefined4 *)(psVar13 + 0x20) = (undefined4)tagType.id;
        *(undefined4 *)(psVar13 + 0x24) = tagType.id._4_4_;
        *(undefined4 *)(psVar13 + 0x28) = uVar3;
        *(undefined4 *)(psVar13 + 0x2c) = uVar4;
        __cxa_throw(psVar13,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar8 = Element::operator[]((Element *)tagType.id,1);
      if (pEVar8->isList_ == false) {
        pEVar8 = Element::operator[]((Element *)tagType.id,1);
        if ((pEVar8->isList_ != false) || ((pEVar8->dollared_ & 1U) == 0)) {
          curr_00 = (Export *)operator_new(0x28);
          (curr_00->value).super_IString.str._M_len = 0;
          (curr_00->value).super_IString.str._M_str = (char *)0x0;
          (curr_00->name).super_IString.str._M_len = 0;
          (curr_00->name).super_IString.str._M_str = (char *)0x0;
          *(undefined8 *)&curr_00->kind = 0;
          pEVar8 = Element::operator[]((Element *)tagType.id,1);
          sVar15 = (string_view)Element::str(pEVar8);
          (curr_00->name).super_IString.str = sVar15;
          pEVar12 = Module::getExportOrNull(this->wasm,(Name)sVar15);
          if (pEVar12 != (Export *)0x0) {
            psVar13 = (string *)__cxa_allocate_exception(0x30);
            local_90 = local_80;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_90,"duplicate export","");
            pEVar8 = Element::operator[]((Element *)tagType.id,1);
            sVar14 = pEVar8->line;
            pEVar8 = Element::operator[]((Element *)tagType.id,1);
            tagType.id = pEVar8->col;
            *(string **)psVar13 = psVar13 + 0x10;
            std::__cxx11::string::_M_construct<char*>(psVar13,local_90,local_90 + local_88);
            *(size_t *)(psVar13 + 0x20) = sVar14;
            *(uintptr_t *)(psVar13 + 0x28) = tagType.id;
            __cxa_throw(psVar13,&ParseException::typeinfo,ParseException::~ParseException);
          }
          pcVar5 = (curr->super_Importable).super_Named.name.super_IString.str._M_str;
          (curr_00->value).super_IString.str._M_len =
               (curr->super_Importable).super_Named.name.super_IString.str._M_len;
          (curr_00->value).super_IString.str._M_str = pcVar5;
          curr_00->kind = Tag;
          Module::addExport(this->wasm,curr_00);
          sVar14 = sVar14 + 1;
          goto LAB_0099be9b;
        }
      }
      psVar13 = (string *)__cxa_allocate_exception(0x30);
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"invalid export name","");
      pEVar8 = Element::operator[]((Element *)tagType.id,1);
      sVar14 = pEVar8->line;
      pEVar8 = Element::operator[]((Element *)tagType.id,1);
      tagType.id = pEVar8->col;
      *(string **)psVar13 = psVar13 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar13,local_f0,local_f0 + local_e8);
      *(size_t *)(psVar13 + 0x20) = sVar14;
      *(uintptr_t *)(psVar13 + 0x28) = tagType.id;
      __cxa_throw(psVar13,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
LAB_0099be9b:
  local_50.id = 1;
  sVar14 = parseTypeUse(this,s,sVar14,&local_50);
  SVar16 = HeapType::getSignature(&local_50);
  curr->sig = SVar16;
  pLVar10 = Element::list(s);
  if ((pLVar10->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).usedElements
      <= sVar14) {
    Module::addTag(this->wasm,curr);
    return;
  }
  psVar13 = (string *)__cxa_allocate_exception(0x30);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"invalid element","");
  pEVar8 = Element::operator[](s,(uint)sVar14);
  tagType.id = pEVar8->line;
  pEVar8 = Element::operator[](s,(uint)sVar14);
  sVar14 = pEVar8->col;
  *(string **)psVar13 = psVar13 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar13,local_70,local_70 + local_68);
  *(uintptr_t *)(psVar13 + 0x20) = tagType.id;
  *(size_t *)(psVar13 + 0x28) = sVar14;
  __cxa_throw(psVar13,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

void SExpressionWasmBuilder::parseTag(Element& s, bool preParseImport) {
  auto tag = std::make_unique<Tag>();
  size_t i = 1;

  // Parse name
  if (s[i]->isStr() && s[i]->dollared()) {
    auto& inner = *s[i++];
    tag->setExplicitName(inner.str());
    if (wasm.getTagOrNull(tag->name)) {
      throw ParseException("duplicate tag", inner.line, inner.col);
    }
  } else {
    tag->name = Name::fromInt(tagCounter);
    assert(!wasm.getTagOrNull(tag->name));
  }
  tagCounter++;
  tagNames.push_back(tag->name);

  // Parse import, if any
  if (i < s.size() && elementStartsWith(*s[i], IMPORT)) {
    assert(preParseImport && "import element in non-preParseImport mode");
    auto& importElem = *s[i++];
    if (importElem.size() != 3) {
      throw ParseException("invalid import", importElem.line, importElem.col);
    }
    if (!importElem[1]->isStr() || importElem[1]->dollared()) {
      throw ParseException(
        "invalid import module name", importElem[1]->line, importElem[1]->col);
    }
    if (!importElem[2]->isStr() || importElem[2]->dollared()) {
      throw ParseException(
        "invalid import base name", importElem[2]->line, importElem[2]->col);
    }
    tag->module = importElem[1]->str();
    tag->base = importElem[2]->str();
  }

  // Parse export, if any
  if (i < s.size() && elementStartsWith(*s[i], EXPORT)) {
    auto& exportElem = *s[i++];
    if (tag->module.is()) {
      throw ParseException("import and export cannot be specified together",
                           exportElem.line,
                           exportElem.col);
    }
    if (exportElem.size() != 2) {
      throw ParseException("invalid export", exportElem.line, exportElem.col);
    }
    if (!exportElem[1]->isStr() || exportElem[1]->dollared()) {
      throw ParseException(
        "invalid export name", exportElem[1]->line, exportElem[1]->col);
    }
    auto ex = std::make_unique<Export>();
    ex->name = exportElem[1]->str();
    if (wasm.getExportOrNull(ex->name)) {
      throw ParseException(
        "duplicate export", exportElem[1]->line, exportElem[1]->col);
    }
    ex->value = tag->name;
    ex->kind = ExternalKind::Tag;
    wasm.addExport(ex.release());
  }

  // Parse typeuse
  HeapType tagType;
  i = parseTypeUse(s, i, tagType);
  tag->sig = tagType.getSignature();

  // If there are more elements, they are invalid
  if (i < s.size()) {
    throw ParseException("invalid element", s[i]->line, s[i]->col);
  }

  wasm.addTag(tag.release());
}